

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_decoder_init_file(char *pFilePath,ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  _func_void_void_ptr_ma_data_source_ptr_ma_allocation_callbacks_ptr *p_Var1;
  bool bVar2;
  ma_result mVar3;
  ma_bool32 mVar4;
  ma_decoding_backend_vtable *pmVar5;
  ulong uVar6;
  ma_data_source *pBackend;
  ma_decoder_config config;
  ma_decoder_config config_1;
  ma_data_source *local_168;
  ma_decoder_config *local_160;
  ma_decoder *local_158;
  ma_decoder_config local_150;
  ma_decoding_backend_config local_c0 [18];
  
  if (pConfig == (ma_decoder_config *)0x0) {
    memset(local_c0,0,0x90);
  }
  else {
    memcpy(local_c0,pConfig,0x90);
  }
  memcpy(&local_150,local_c0,0x90);
  mVar3 = ma_decoder__preinit((ma_decoder_read_proc)0x0,(ma_decoder_seek_proc)0x0,
                              (ma_decoder_tell_proc)0x0,(void *)0x0,&local_150,pDecoder);
  if (mVar3 == MA_SUCCESS) {
    if (pFilePath == (char *)0x0) {
      mVar3 = MA_INVALID_ARGS;
    }
    else {
      mVar3 = (uint)(*pFilePath != '\0') * 2 + MA_INVALID_ARGS;
    }
  }
  if (mVar3 != MA_SUCCESS) {
    return mVar3;
  }
  mVar3 = MA_NO_BACKEND;
  if (local_150.encodingFormat != ma_encoding_format_unknown) {
    mVar3 = MA_NO_BACKEND;
    if (local_150.encodingFormat == ma_encoding_format_wav) {
      if (g_ma_decoding_backend_vtable_wav.onInitFile ==
          (_func_ma_result_void_ptr_char_ptr_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
           *)0x0) {
        mVar3 = MA_NOT_IMPLEMENTED;
      }
      else {
        mVar3 = (*g_ma_decoding_backend_vtable_wav.onInitFile)
                          ((void *)0x0,pFilePath,local_c0,&pDecoder->allocationCallbacks,&local_168)
        ;
        if (mVar3 == MA_SUCCESS) {
          pDecoder->pBackend = local_168;
          pDecoder->pBackendVTable = &g_ma_decoding_backend_vtable_wav;
          pDecoder->pBackendUserData = local_150.pCustomBackendUserData;
          mVar3 = MA_SUCCESS;
        }
      }
    }
    if (local_150.encodingFormat == ma_encoding_format_flac) {
      if (g_ma_decoding_backend_vtable_flac.onInitFile ==
          (_func_ma_result_void_ptr_char_ptr_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
           *)0x0) {
        mVar3 = MA_NOT_IMPLEMENTED;
      }
      else {
        mVar3 = (*g_ma_decoding_backend_vtable_flac.onInitFile)
                          ((void *)0x0,pFilePath,local_c0,&pDecoder->allocationCallbacks,&local_168)
        ;
        if (mVar3 == MA_SUCCESS) {
          pDecoder->pBackend = local_168;
          pDecoder->pBackendVTable = &g_ma_decoding_backend_vtable_flac;
          pDecoder->pBackendUserData = local_150.pCustomBackendUserData;
          mVar3 = MA_SUCCESS;
        }
      }
    }
    if (local_150.encodingFormat == ma_encoding_format_mp3) {
      if (g_ma_decoding_backend_vtable_mp3.onInitFile ==
          (_func_ma_result_void_ptr_char_ptr_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
           *)0x0) {
        mVar3 = MA_NOT_IMPLEMENTED;
      }
      else {
        mVar3 = (*g_ma_decoding_backend_vtable_mp3.onInitFile)
                          ((void *)0x0,pFilePath,local_c0,&pDecoder->allocationCallbacks,&local_168)
        ;
        if (mVar3 == MA_SUCCESS) {
          pDecoder->pBackend = local_168;
          pDecoder->pBackendVTable = &g_ma_decoding_backend_vtable_mp3;
          pDecoder->pBackendUserData = local_150.pCustomBackendUserData;
          mVar3 = MA_SUCCESS;
        }
      }
    }
    if (local_150.encodingFormat == ma_encoding_format_vorbis) {
      if (g_ma_decoding_backend_vtable_stbvorbis.onInitFile ==
          (_func_ma_result_void_ptr_char_ptr_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
           *)0x0) {
        mVar3 = MA_NOT_IMPLEMENTED;
      }
      else {
        mVar3 = (*g_ma_decoding_backend_vtable_stbvorbis.onInitFile)
                          ((void *)0x0,pFilePath,local_c0,&pDecoder->allocationCallbacks,&local_168)
        ;
        if (mVar3 == MA_SUCCESS) {
          pDecoder->pBackend = local_168;
          pDecoder->pBackendVTable = &g_ma_decoding_backend_vtable_stbvorbis;
          pDecoder->pBackendUserData = local_150.pCustomBackendUserData;
          mVar3 = MA_SUCCESS;
        }
      }
    }
  }
  if (mVar3 == MA_SUCCESS) goto LAB_00171b95;
  bVar2 = true;
  if ((local_150.ppCustomBackendVTables != (ma_decoding_backend_vtable **)0x0) &&
     (local_150.customBackendCount != 0)) {
    uVar6 = 0;
    local_160 = pConfig;
    local_158 = pDecoder;
    do {
      pmVar5 = local_150.ppCustomBackendVTables[uVar6];
      if (((pmVar5 != (ma_decoding_backend_vtable *)0x0) &&
          (pmVar5->onInitFile !=
           (_func_ma_result_void_ptr_char_ptr_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
            *)0x0)) &&
         (mVar3 = (*pmVar5->onInitFile)
                            (local_150.pCustomBackendUserData,pFilePath,local_c0,
                             &pDecoder->allocationCallbacks,&local_168), mVar3 == MA_SUCCESS)) {
        local_158->pBackend = local_168;
        local_158->pBackendVTable = pmVar5;
        local_158->pBackendUserData = local_150.pCustomBackendUserData;
        bVar2 = false;
        pConfig = local_160;
        pDecoder = local_158;
        goto LAB_00171914;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_150.customBackendCount);
    bVar2 = true;
    pConfig = local_160;
    pDecoder = local_158;
  }
LAB_00171914:
  if ((bVar2) && (local_150.encodingFormat != ma_encoding_format_unknown)) {
    return MA_NO_BACKEND;
  }
  if (!bVar2) goto LAB_00171b95;
  mVar4 = ma_path_extension_equal(pFilePath,"wav");
  if (((mVar4 == 0) ||
      (g_ma_decoding_backend_vtable_wav.onInitFile ==
       (_func_ma_result_void_ptr_char_ptr_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
        *)0x0)) ||
     (mVar3 = (*g_ma_decoding_backend_vtable_wav.onInitFile)
                        ((void *)0x0,pFilePath,local_c0,&pDecoder->allocationCallbacks,&local_168),
     mVar3 != MA_SUCCESS)) {
    mVar4 = ma_path_extension_equal(pFilePath,"flac");
    if (((mVar4 == 0) ||
        (g_ma_decoding_backend_vtable_flac.onInitFile ==
         (_func_ma_result_void_ptr_char_ptr_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
          *)0x0)) ||
       (mVar3 = (*g_ma_decoding_backend_vtable_flac.onInitFile)
                          ((void *)0x0,pFilePath,local_c0,&pDecoder->allocationCallbacks,&local_168)
       , mVar3 != MA_SUCCESS)) {
      mVar4 = ma_path_extension_equal(pFilePath,"mp3");
      if (((mVar4 == 0) ||
          (g_ma_decoding_backend_vtable_mp3.onInitFile ==
           (_func_ma_result_void_ptr_char_ptr_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
            *)0x0)) ||
         (mVar3 = (*g_ma_decoding_backend_vtable_mp3.onInitFile)
                            ((void *)0x0,pFilePath,local_c0,&pDecoder->allocationCallbacks,
                             &local_168), mVar3 != MA_SUCCESS)) {
        mVar4 = ma_path_extension_equal(pFilePath,"ogg");
        if (((mVar4 == 0) ||
            (g_ma_decoding_backend_vtable_stbvorbis.onInitFile ==
             (_func_ma_result_void_ptr_char_ptr_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
              *)0x0)) ||
           (mVar3 = (*g_ma_decoding_backend_vtable_stbvorbis.onInitFile)
                              ((void *)0x0,pFilePath,local_c0,&pDecoder->allocationCallbacks,
                               &local_168), mVar3 != MA_SUCCESS)) {
          if ((g_ma_decoding_backend_vtable_wav.onInitFile ==
               (_func_ma_result_void_ptr_char_ptr_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
                *)0x0) ||
             (mVar3 = (*g_ma_decoding_backend_vtable_wav.onInitFile)
                                ((void *)0x0,pFilePath,local_c0,&pDecoder->allocationCallbacks,
                                 &local_168), mVar3 != MA_SUCCESS)) {
            mVar3 = ma_decoder_init_from_file__internal
                              (&g_ma_decoding_backend_vtable_flac,(void *)0x0,pFilePath,&local_150,
                               pDecoder);
            if ((mVar3 != MA_SUCCESS) &&
               ((mVar3 = ma_decoder_init_from_file__internal
                                   (&g_ma_decoding_backend_vtable_mp3,(void *)0x0,pFilePath,
                                    &local_150,pDecoder), mVar3 != MA_SUCCESS &&
                (mVar3 = ma_decoder_init_from_file__internal
                                   (&g_ma_decoding_backend_vtable_stbvorbis,(void *)0x0,pFilePath,
                                    &local_150,pDecoder), mVar3 != MA_SUCCESS)))) {
              mVar3 = ma_decoder_init_vfs((ma_vfs *)0x0,pFilePath,pConfig,pDecoder);
              if (mVar3 == MA_SUCCESS) {
                return MA_SUCCESS;
              }
              return mVar3;
            }
            goto LAB_00171b95;
          }
          goto LAB_00171b43;
        }
        pDecoder->pBackend = local_168;
        pmVar5 = &g_ma_decoding_backend_vtable_stbvorbis;
      }
      else {
        pDecoder->pBackend = local_168;
        pmVar5 = &g_ma_decoding_backend_vtable_mp3;
      }
    }
    else {
      pDecoder->pBackend = local_168;
      pmVar5 = &g_ma_decoding_backend_vtable_flac;
    }
  }
  else {
LAB_00171b43:
    pDecoder->pBackend = local_168;
    pmVar5 = &g_ma_decoding_backend_vtable_wav;
  }
  pDecoder->pBackendVTable = pmVar5;
  pDecoder->pBackendUserData = local_150.pCustomBackendUserData;
LAB_00171b95:
  mVar3 = ma_decoder__postinit(&local_150,pDecoder);
  if (mVar3 == MA_SUCCESS) {
    return MA_SUCCESS;
  }
  if (pDecoder->pBackendVTable != (ma_decoding_backend_vtable *)0x0) {
    p_Var1 = pDecoder->pBackendVTable->onUninit;
    if (p_Var1 != (_func_void_void_ptr_ma_data_source_ptr_ma_allocation_callbacks_ptr *)0x0) {
      (*p_Var1)(pDecoder->pBackendUserData,&pDecoder->pBackend,&pDecoder->allocationCallbacks);
      return mVar3;
    }
    return mVar3;
  }
  return mVar3;
}

Assistant:

MA_API ma_result ma_decoder_init_file(const char* pFilePath, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;
    ma_decoder_config config;

    config = ma_decoder_config_init_copy(pConfig);
    result = ma_decoder__preinit_file(pFilePath, &config, pDecoder);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* If the backend has support for loading from a file path we'll want to use that. If that all fails we'll fall back to the VFS path. */
    result = MA_NO_BACKEND;

    if (config.encodingFormat != ma_encoding_format_unknown) {
    #ifdef MA_HAS_WAV
        if (config.encodingFormat == ma_encoding_format_wav) {
            result = ma_decoder_init_wav_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (config.encodingFormat == ma_encoding_format_flac) {
            result = ma_decoder_init_flac_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_MP3
        if (config.encodingFormat == ma_encoding_format_mp3) {
            result = ma_decoder_init_mp3_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (config.encodingFormat == ma_encoding_format_vorbis) {
            result = ma_decoder_init_vorbis_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    }

    if (result != MA_SUCCESS) {
        /* Getting here means we weren't able to initialize a decoder of a specific encoding format. */

        /*
        We use trial and error to open a decoder. We prioritize custom decoders so that if they
        implement the same encoding format they take priority over the built-in decoders.
        */
        result = ma_decoder_init_custom_from_file__internal(pFilePath, &config, pDecoder);

        /*
        If we get to this point and we still haven't found a decoder, and the caller has requested a
        specific encoding format, there's no hope for it. Abort.
        */
        if (result != MA_SUCCESS && config.encodingFormat != ma_encoding_format_unknown) {
            return MA_NO_BACKEND;
        }

        /* First try loading based on the file extension so we don't waste time opening and closing files. */
    #ifdef MA_HAS_WAV
        if (result != MA_SUCCESS && ma_path_extension_equal(pFilePath, "wav")) {
            result = ma_decoder_init_wav_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (result != MA_SUCCESS && ma_path_extension_equal(pFilePath, "flac")) {
            result = ma_decoder_init_flac_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_MP3
        if (result != MA_SUCCESS && ma_path_extension_equal(pFilePath, "mp3")) {
            result = ma_decoder_init_mp3_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (result != MA_SUCCESS && ma_path_extension_equal(pFilePath, "ogg")) {
            result = ma_decoder_init_vorbis_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif

        /*
        If we still haven't got a result just use trial and error. Custom decoders have already been attempted, so here we
        need only iterate over our stock decoders.
        */
        if (result != MA_SUCCESS) {
        #ifdef MA_HAS_WAV
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_wav_from_file__internal(pFilePath, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_FLAC
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_flac_from_file__internal(pFilePath, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_MP3
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_mp3_from_file__internal(pFilePath, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_VORBIS
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_vorbis_from_file__internal(pFilePath, &config, pDecoder);
            }
        #endif
        }
    }

    /*
    If at this point we still haven't successfully initialized the decoder it most likely means
    the backend doesn't have an implementation for loading from a file path. We'll try using
    miniaudio's built-in file IO for loading file.
    */
    if (result == MA_SUCCESS) {
        /* Initialization was successful. Finish up. */
        result = ma_decoder__postinit(&config, pDecoder);
        if (result != MA_SUCCESS) {
            /*
            The backend was initialized successfully, but for some reason post-initialization failed. This is most likely
            due to an out of memory error. We're going to abort with an error here and not try to recover.
            */
            if (pDecoder->pBackendVTable != NULL && pDecoder->pBackendVTable->onUninit != NULL) {
                pDecoder->pBackendVTable->onUninit(pDecoder->pBackendUserData, &pDecoder->pBackend, &pDecoder->allocationCallbacks);
            }

            return result;
        }
    } else {
        /* Probably no implementation for loading from a file path. Use miniaudio's file IO instead. */
        result = ma_decoder_init_vfs(NULL, pFilePath, pConfig, pDecoder);
        if (result != MA_SUCCESS) {
            return result;
        }
    }

    return MA_SUCCESS;
}